

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_ventriloquate(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  CHAR_DATA *ch_00;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  string buffer1;
  string buffer2;
  char speaker [4608];
  long *local_14c0 [2];
  long local_14b0 [2];
  CHAR_DATA *local_14a0;
  long *local_1498 [2];
  long local_1488 [2];
  char *local_1478 [2];
  char *local_1468;
  buffer<char> local_1450;
  char local_1430 [504];
  char local_1238 [4616];
  
  local_14a0 = ch;
  target_name = one_argument(target_name,local_1238);
  local_1450.size_ = 0;
  local_1450._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
  local_1450.capacity_ = 500;
  fmt.size_ = 0xf;
  fmt.data_ = "{} says \'{}\'.\n\r";
  args.field_1.values_ =
       (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_1478;
  args.desc_ = 0xcc;
  local_1478[0] = local_1238;
  local_1468 = target_name;
  local_1450.ptr_ = local_1430;
  ::fmt::v9::detail::vformat_to<char>(&local_1450,fmt,args,(locale_ref)0x0);
  local_14c0[0] = local_14b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14c0,local_1450.ptr_,local_1450.ptr_ + local_1450.size_);
  if (local_1450.ptr_ != local_1430) {
    operator_delete(local_1450.ptr_,local_1450.capacity_);
  }
  local_1468 = target_name;
  local_1450.size_ = 0;
  local_1450._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
  local_1450.capacity_ = 500;
  fmt_00.size_ = 0x1c;
  fmt_00.data_ = "Someone makes {} say \'{}\'.\n\r";
  args_00.field_1.values_ =
       (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_1478;
  args_00.desc_ = 0xcc;
  local_1478[0] = local_1238;
  local_1450.ptr_ = local_1430;
  ::fmt::v9::detail::vformat_to<char>(&local_1450,fmt_00,args_00,(locale_ref)0x0);
  local_1498[0] = local_1488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1498,local_1450.ptr_,local_1450.ptr_ + local_1450.size_);
  if (local_1450.ptr_ != local_1430) {
    operator_delete(local_1450.ptr_,local_1450.capacity_);
  }
  plVar1 = local_14c0[0];
  iVar3 = toupper((int)(char)*local_14c0[0]);
  *(char *)plVar1 = (char)iVar3;
  ch_00 = local_14a0->in_room->people;
  if (ch_00 != (CHAR_DATA *)0x0) {
    do {
      bVar2 = is_exact_name(local_1238,ch_00->name);
      if (!bVar2) {
        bVar2 = is_awake(ch_00);
        if (bVar2) {
          bVar2 = saves_spell(level,ch_00,0x10);
          psVar4 = (string *)local_14c0;
          if (bVar2) {
            psVar4 = (string *)local_1498;
          }
          send_to_char(*(char **)psVar4,ch_00);
        }
      }
      ch_00 = ch_00->next_in_room;
    } while (ch_00 != (CHAR_DATA *)0x0);
  }
  if (local_1498[0] != local_1488) {
    operator_delete(local_1498[0],local_1488[0] + 1);
  }
  if (local_14c0[0] != local_14b0) {
    operator_delete(local_14c0[0],local_14b0[0] + 1);
  }
  return;
}

Assistant:

void spell_ventriloquate(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char speaker[MAX_INPUT_LENGTH];
	CHAR_DATA *vch;

	target_name = one_argument(target_name, speaker);

	auto buffer1 = fmt::format("{} says '{}'.\n\r", speaker, target_name);
	auto buffer2 = fmt::format("Someone makes {} say '{}'.\n\r", speaker, target_name);
	buffer1[0] = toupper(buffer1[0]);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
	{
		if (!is_exact_name(speaker, vch->name) && is_awake(vch))
			send_to_char(saves_spell(level, vch, DAM_OTHER) ? buffer2.c_str() : buffer1.c_str(), vch);
	}
}